

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_error.cc
# Opt level: O0

void RM_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  RC rc_local;
  
  if ((rc < 0x65) || (0x6f < rc)) {
    if ((-rc < 0x65) || (100 < -rc)) {
      if (rc == -0xb) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        poVar1 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::operator<<(poVar1,"\n");
      }
      else if (rc == 0) {
        std::operator<<((ostream *)&std::cerr,"RM_PrintError called with return code of 0\n");
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cerr,"RM error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        std::operator<<(poVar1," is out of bounds\n");
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cerr,"RM error: ");
      poVar1 = std::operator<<(poVar1,RM_ErrorMsg[-0x65 - rc]);
      std::operator<<(poVar1,"\n");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"RM warning: ");
    poVar1 = std::operator<<(poVar1,RM_WarnMsg[rc + -0x65]);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void RM_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_RM_WARN && rc <= RM_LASTWARN)
    // Print warning
    cerr << "RM warning: " << RM_WarnMsg[rc - START_RM_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_RM_ERR && -rc < -RM_LASTERROR)
    // Print error
    cerr << "RM error: " << RM_ErrorMsg[-rc + START_RM_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "RM_PrintError called with return code of 0\n";
  else
    cerr << "RM error: " << rc << " is out of bounds\n";
}